

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xstcMetadata(char *metadata,char *base)

{
  int iVar1;
  long lVar2;
  xmlNodePtr cur_00;
  int local_44;
  long lStack_40;
  int ret;
  xmlChar *name;
  xmlChar *contributor;
  xmlNodePtr cur;
  xmlDocPtr doc;
  char *base_local;
  char *metadata_local;
  
  local_44 = 0;
  lVar2 = xmlReadFile(metadata,0,2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse %s\n",metadata);
    metadata_local._4_4_ = -1;
  }
  else {
    cur_00 = (xmlNodePtr)xmlDocGetRootElement(lVar2);
    if ((cur_00 == (xmlNodePtr)0x0) || (iVar1 = xmlStrEqual(cur_00->name,"testSet"), iVar1 == 0)) {
      fprintf(_stderr,"Unexpected format %s\n",metadata);
      metadata_local._4_4_ = -1;
    }
    else {
      name = (xmlChar *)xmlGetProp(cur_00,"contributor");
      if (name == (xmlChar *)0x0) {
        name = (xmlChar *)xmlStrdup("Unknown");
      }
      lStack_40 = xmlGetProp(cur_00,"name");
      if (lStack_40 == 0) {
        lStack_40 = xmlStrdup("Unknown");
      }
      printf("## %s test suite for Schemas version %s\n",name,lStack_40);
      (*_xmlFree)(name);
      (*_xmlFree)(lStack_40);
      contributor = (xmlChar *)getNext(cur_00,"./ts:testGroup[1]");
      if (((xmlNodePtr)contributor == (xmlNodePtr)0x0) ||
         (iVar1 = xmlStrEqual(((xmlNodePtr)contributor)->name,"testGroup"), iVar1 == 0)) {
        fprintf(_stderr,"Unexpected format %s\n",metadata);
        local_44 = -1;
      }
      else {
        for (; contributor != (xmlChar *)0x0;
            contributor = (xmlChar *)
                          getNext((xmlNodePtr)contributor,"following-sibling::ts:testGroup[1]")) {
          xstcTestGroup((xmlNodePtr)contributor,base);
        }
      }
      xmlFreeDoc(lVar2);
      metadata_local._4_4_ = local_44;
    }
  }
  return metadata_local._4_4_;
}

Assistant:

static int
xstcMetadata(const char *metadata, const char *base) {
    xmlDocPtr doc;
    xmlNodePtr cur;
    xmlChar *contributor;
    xmlChar *name;
    int ret = 0;

    doc = xmlReadFile(metadata, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", metadata);
	return(-1);
    }

    cur = xmlDocGetRootElement(doc);
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testSet"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	return(-1);
    }
    contributor = xmlGetProp(cur, BAD_CAST "contributor");
    if (contributor == NULL) {
        contributor = xmlStrdup(BAD_CAST "Unknown");
    }
    name = xmlGetProp(cur, BAD_CAST "name");
    if (name == NULL) {
        name = xmlStrdup(BAD_CAST "Unknown");
    }
    printf("## %s test suite for Schemas version %s\n", contributor, name);
    xmlFree(contributor);
    xmlFree(name);

    cur = getNext(cur, "./ts:testGroup[1]");
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testGroup"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	ret = -1;
	goto done;
    }
    while (cur != NULL) {
        xstcTestGroup(cur, base);
	cur = getNext(cur, "following-sibling::ts:testGroup[1]");
    }

done:
    xmlFreeDoc(doc);
    return(ret);
}